

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec3 __thiscall djb::microfacet::u2_to_s2(microfacet *this,vec2 *u,vec3 *wi,void *user_args)

{
  long lVar1;
  args *paVar2;
  float fVar3;
  vec3 vVar4;
  vec3 vVar5;
  args args;
  vec3 local_70;
  args local_64;
  
  if (user_args == (void *)0x0) {
    local_70.x = 0.0;
    local_70.y = 0.0;
    local_70.z = 1.0;
    microfacet::args::normalmap(&local_64,&local_70,1.0,1.0,0.0);
  }
  else {
    paVar2 = &local_64;
    for (lVar1 = 0x13; lVar1 != 0; lVar1 = lVar1 + -1) {
      (paVar2->mtra).r[0].x = *user_args;
      user_args = (float_t *)((long)user_args + 4);
      paVar2 = (args *)&(paVar2->mtra).r[0].y;
    }
  }
  vVar4 = u2_to_h2(this,u,wi,&local_64);
  fVar3 = wi->z * vVar4.z + wi->x * vVar4.x + wi->y * vVar4.y;
  fVar3 = fVar3 + fVar3;
  vVar5.x = vVar4.x * fVar3 - wi->x;
  vVar5.y = vVar4.y * fVar3 - wi->y;
  vVar5.z = vVar4.z * fVar3 - wi->z;
  return vVar5;
}

Assistant:

vec3
microfacet::u2_to_s2(const vec2 &u, const vec3 &wi, const void *user_args) const
{
	//DJB_ASSERT(wi.z >= 0 && "invalid incident direction");
	microfacet::args args =
		user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
		          : microfacet::args::standard();

	return h2_to_s2(u2_to_h2(u, wi, args), wi);
}